

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O0

void wasm::
     CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
     ::doStartLoop(Optimizer *self,Expression **currp)

{
  BasicBlock *__from;
  BasicBlock *last;
  Expression **currp_local;
  Optimizer *self_local;
  
  __from = (self->
           super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
           ).
           super_CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
           .currBasicBlock;
  startBasicBlock(&(self->
                   super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
                   ).
                   super_CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
                 );
  std::
  vector<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*>_>
  ::push_back(&(self->
               super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
               ).
               super_CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
               .loopTops,
              &(self->
               super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
               ).
               super_CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
               .currBasicBlock);
  link(&(self->
        super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
        ).
        super_CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
       ,(char *)__from,
       (char *)(self->
               super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
               ).
               super_CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
               .currBasicBlock);
  std::
  vector<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock_*>_>
  ::push_back(&(self->
               super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
               ).
               super_CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
               .loopStack,
              &(self->
               super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
               ).
               super_CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
               .currBasicBlock);
  return;
}

Assistant:

static void doStartLoop(SubType* self, Expression** currp) {
    auto* last = self->currBasicBlock;
    self->startBasicBlock();
    // a loop with no backedges would still be counted here, but oh well
    self->loopTops.push_back(self->currBasicBlock);
    self->link(last, self->currBasicBlock);
    self->loopStack.push_back(self->currBasicBlock);
  }